

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool BeginPopupEx(char *str_id,ImGuiWindowFlags extra_flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  char local_58 [7];
  bool is_open;
  char name [32];
  ImGuiWindowFlags flags;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags extra_flags_local;
  char *str_id_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  name._28_4_ = ImGuiWindow::GetID(pIVar1,str_id,(char *)0x0);
  bVar3 = IsPopupOpen(name._28_4_);
  if (bVar3) {
    ImGui::PushStyleVar(2,0.0);
    name._24_4_ = extra_flags | 0x2000147;
    if ((extra_flags & 0x8000000U) == 0) {
      ImFormatString(local_58,0x14,"##popup_%08x",(ulong)(uint)name._28_4_);
    }
    else {
      ImFormatString(local_58,0x14,"##menu_%d",(ulong)(uint)(pIVar2->CurrentPopupStack).Size);
    }
    str_id_local._7_1_ = ImGui::Begin(local_58,(bool *)0x0,name._24_4_);
    if ((pIVar1->Flags & 0x80U) == 0) {
      pIVar1 = pIVar2->CurrentWindow;
      pIVar1->Flags = pIVar1->Flags & 0xffffff7f;
    }
    if (!str_id_local._7_1_) {
      ImGui::EndPopup();
    }
  }
  else {
    ClearSetNextWindowData();
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

static bool BeginPopupEx(const char* str_id, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(str_id);
    if (!IsPopupOpen(id))
    {
        ClearSetNextWindowData(); // We behave like Begin() and need to consume those values
        return false;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    ImGuiWindowFlags flags = extra_flags|ImGuiWindowFlags_Popup|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_AlwaysAutoResize;

    char name[32];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, 20, "##menu_%d", g.CurrentPopupStack.Size);    // Recycle windows based on depth
    else
        ImFormatString(name, 20, "##popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = ImGui::Begin(name, NULL, flags);
    if (!(window->Flags & ImGuiWindowFlags_ShowBorders))
        g.CurrentWindow->Flags &= ~ImGuiWindowFlags_ShowBorders;
    if (!is_open) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        ImGui::EndPopup();

    return is_open;
}